

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Start_Resume_PDU::Start_Resume_PDU
          (Start_Resume_PDU *this,Simulation_Management_Header *SimMgrHeader,
          ClockTime *RealWorldTime,ClockTime *SimTime,KUINT32 ReqID)

{
  KUINT32 KVar1;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,SimMgrHeader);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Start_Resume_PDU_00215670;
  (this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002166f8;
  KVar1 = RealWorldTime->m_ui32TimePastHour;
  (this->m_RealWorldTime).m_i32Hour = RealWorldTime->m_i32Hour;
  (this->m_RealWorldTime).m_ui32TimePastHour = KVar1;
  (this->m_SimTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002166f8;
  KVar1 = SimTime->m_ui32TimePastHour;
  (this->m_SimTime).m_i32Hour = SimTime->m_i32Hour;
  (this->m_SimTime).m_ui32TimePastHour = KVar1;
  this->m_ui32RequestID = ReqID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\r';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  return;
}

Assistant:

Start_Resume_PDU::Start_Resume_PDU( const Simulation_Management_Header & SimMgrHeader, const ClockTime & RealWorldTime,
                                    const ClockTime & SimTime, KUINT32 ReqID  ) :
    Simulation_Management_Header( SimMgrHeader ),
    m_RealWorldTime( RealWorldTime ),
    m_SimTime( SimTime ),
    m_ui32RequestID( ReqID )
{
    m_ui8PDUType = Start_Resume_PDU_Type;
    m_ui16PDULength = START_RESUME_PDU_SIZE;
}